

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_arc.cpp
# Opt level: O0

void __thiscall agg::arc::normalize(arc *this,double a1,double a2,bool ccw)

{
  double dVar1;
  double ra;
  double dStack_20;
  bool ccw_local;
  double a2_local;
  double a1_local;
  arc *this_local;
  
  dVar1 = (ABS(this->m_rx) + ABS(this->m_ry)) / 2.0;
  dVar1 = acos(dVar1 / (dVar1 + 0.125 / this->m_scale));
  this->m_da = dVar1 * 2.0;
  dStack_20 = a2;
  a2_local = a1;
  if (ccw) {
    for (; dStack_20 < a1; dStack_20 = dStack_20 + 6.283185307179586) {
    }
  }
  else {
    for (; a2_local < a2; a2_local = a2_local + 6.283185307179586) {
    }
    this->m_da = -this->m_da;
  }
  this->m_ccw = ccw;
  this->m_start = a2_local;
  this->m_end = dStack_20;
  this->m_initialized = true;
  return;
}

Assistant:

void arc::normalize(double a1, double a2, bool ccw)
    {
        double ra = (fabs(m_rx) + fabs(m_ry)) / 2;
        m_da = acos(ra / (ra + 0.125 / m_scale)) * 2;
        if(ccw)
        {
            while(a2 < a1) a2 += pi * 2.0;
        }
        else
        {
            while(a1 < a2) a1 += pi * 2.0;
            m_da = -m_da;
        }
        m_ccw   = ccw;
        m_start = a1;
        m_end   = a2;
        m_initialized = true;
    }